

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

bool duckdb::StringValueResult::UnsetComment(StringValueResult *result,idx_t buffer_pos)

{
  ulong buffer_pos_00;
  bool bVar1;
  ulong uVar2;
  
  uVar2 = (result->super_ScannerResult).last_position.buffer_pos;
  buffer_pos_00 = result->position_before_comment;
  if (uVar2 < buffer_pos_00) {
    do {
      if (result->buffer_ptr[uVar2] != ' ') goto LAB_00d25ed2;
      uVar2 = uVar2 + 1;
    } while (buffer_pos_00 != uVar2);
  }
  else if (result->cur_col_id != 0) {
LAB_00d25ed2:
    bVar1 = AddRow(result,buffer_pos_00);
    goto LAB_00d25ede;
  }
  bVar1 = false;
LAB_00d25ede:
  if (result->number_of_rows == 0) {
    result->first_line_is_comment = true;
  }
  (result->super_ScannerResult).comment = false;
  (result->super_ScannerResult).last_position.buffer_pos =
       ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
        new_line.value == CARRY_ON) + buffer_pos + 1;
  result->cur_col_id = 0;
  result->chunk_col_id = 0;
  return bVar1;
}

Assistant:

bool StringValueResult::UnsetComment(StringValueResult &result, idx_t buffer_pos) {
	bool done = false;
	if (result.last_position.buffer_pos < result.position_before_comment) {
		bool all_empty = true;
		for (idx_t i = result.last_position.buffer_pos; i < result.position_before_comment; i++) {
			if (result.buffer_ptr[i] != ' ') {
				all_empty = false;
				break;
			}
		}
		if (!all_empty) {
			done = AddRow(result, result.position_before_comment);
		}
	} else {
		if (result.cur_col_id != 0) {
			done = AddRow(result, result.position_before_comment);
		}
	}
	if (result.number_of_rows == 0) {
		result.first_line_is_comment = true;
	}
	result.comment = false;
	if (result.state_machine.dialect_options.state_machine_options.new_line.GetValue() != NewLineIdentifier::CARRY_ON) {
		result.last_position.buffer_pos = buffer_pos + 1;
	} else {
		result.last_position.buffer_pos = buffer_pos + 2;
	}
	result.cur_col_id = 0;
	result.chunk_col_id = 0;
	return done;
}